

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O3

uint tinyobj::updateVertex
               (map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
                *vertexCache,vector<float,_std::allocator<float>_> *positions,
               vector<float,_std::allocator<float>_> *normals,
               vector<float,_std::allocator<float>_> *texcoords,
               vector<float,_std::allocator<float>_> *in_positions,
               vector<float,_std::allocator<float>_> *in_normals,
               vector<float,_std::allocator<float>_> *in_texcoords,vertex_index *i)

{
  iterator iVar1;
  pointer pfVar2;
  mapped_type_conflict *pmVar3;
  long lVar4;
  float *pfVar5;
  iterator iVar6;
  uint uVar7;
  
  iVar1 = std::
          _Rb_tree<tinyobj::vertex_index,_std::pair<const_tinyobj::vertex_index,_unsigned_int>,_std::_Select1st<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
          ::find(&vertexCache->_M_t,i);
  if ((_Rb_tree_header *)iVar1._M_node == &(vertexCache->_M_t)._M_impl.super__Rb_tree_header) {
    pfVar2 = (in_positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar6._M_current =
         (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    lVar4 = (long)i->v_idx;
    pfVar5 = (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar6._M_current == pfVar5) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)positions,iVar6,pfVar2 + lVar4 * 3);
      pfVar2 = (in_positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar6._M_current =
           (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pfVar5 = (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      lVar4 = (long)i->v_idx;
    }
    else {
      *iVar6._M_current = pfVar2[lVar4 * 3];
      iVar6._M_current = iVar6._M_current + 1;
      (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
      ._M_finish = iVar6._M_current;
    }
    if (iVar6._M_current == pfVar5) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)positions,iVar6,pfVar2 + lVar4 * 3 + 1);
      pfVar2 = (in_positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar6._M_current =
           (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pfVar5 = (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      lVar4 = (long)i->v_idx;
    }
    else {
      *iVar6._M_current = pfVar2[lVar4 * 3 + 1];
      iVar6._M_current = iVar6._M_current + 1;
      (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
      ._M_finish = iVar6._M_current;
    }
    if (iVar6._M_current == pfVar5) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)positions,iVar6,pfVar2 + lVar4 * 3U + 2);
    }
    else {
      *iVar6._M_current = pfVar2[lVar4 * 3U + 2];
      (positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
      ._M_finish = iVar6._M_current + 1;
    }
    uVar7 = i->vn_idx;
    if ((-1 < (int)uVar7) &&
       (pfVar2 = (in_normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start,
       (ulong)uVar7 * 3 + 2 <
       (ulong)((long)(in_normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar2 >> 2))) {
      iVar6._M_current =
           (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pfVar5 = (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (iVar6._M_current == pfVar5) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)normals,iVar6,pfVar2 + (ulong)uVar7 * 3);
        pfVar2 = (in_normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6._M_current =
             (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pfVar5 = (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        uVar7 = i->vn_idx;
      }
      else {
        *iVar6._M_current = pfVar2[(ulong)uVar7 * 3];
        iVar6._M_current = iVar6._M_current + 1;
        (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar6._M_current;
      }
      lVar4 = (long)(int)uVar7;
      if (iVar6._M_current == pfVar5) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)normals,iVar6,pfVar2 + lVar4 * 3 + 1);
        pfVar2 = (in_normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6._M_current =
             (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pfVar5 = (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        lVar4 = (long)i->vn_idx;
      }
      else {
        *iVar6._M_current = pfVar2[lVar4 * 3 + 1];
        iVar6._M_current = iVar6._M_current + 1;
        (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar6._M_current;
      }
      if (iVar6._M_current == pfVar5) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)normals,iVar6,pfVar2 + lVar4 * 3 + 2);
      }
      else {
        *iVar6._M_current = pfVar2[lVar4 * 3 + 2];
        (normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar6._M_current + 1;
      }
    }
    uVar7 = i->vt_idx;
    if (-1 < (int)uVar7) {
      pfVar2 = (in_texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)uVar7 * 2 + 1 <
          (ulong)((long)(in_texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar2 >> 2)) {
        iVar6._M_current =
             (texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pfVar5 = (texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (iVar6._M_current == pfVar5) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)texcoords,iVar6,
                     pfVar2 + ((ulong)uVar7 * 2 & 0xffffffff));
          pfVar2 = (in_texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar6._M_current =
               (texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          pfVar5 = (texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          uVar7 = i->vt_idx;
        }
        else {
          *iVar6._M_current = pfVar2[(ulong)uVar7 * 2 & 0xffffffff];
          iVar6._M_current = iVar6._M_current + 1;
          (texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current;
        }
        if (iVar6._M_current == pfVar5) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)texcoords,iVar6,
                     pfVar2 + (long)(int)uVar7 * 2 + 1);
        }
        else {
          *iVar6._M_current = pfVar2[(long)(int)uVar7 * 2 + 1];
          (texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
      }
    }
    uVar7 = (int)((ulong)((long)(positions->super__Vector_base<float,_std::allocator<float>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(positions->super__Vector_base<float,_std::allocator<float>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 2) / 3) - 1;
    pmVar3 = std::
             map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
             ::operator[](vertexCache,i);
    *pmVar3 = uVar7;
  }
  else {
    uVar7 = *(uint *)((long)&iVar1._M_node[1]._M_parent + 4);
  }
  return uVar7;
}

Assistant:

static unsigned int
updateVertex(std::map<vertex_index, unsigned int> &vertexCache,
             std::vector<float> &positions, std::vector<float> &normals,
             std::vector<float> &texcoords,
             const std::vector<float> &in_positions,
             const std::vector<float> &in_normals,
             const std::vector<float> &in_texcoords, const vertex_index &i) {
  const std::map<vertex_index, unsigned int>::iterator it = vertexCache.find(i);

  if (it != vertexCache.end()) {
    // found cache
    return it->second;
  }

  assert(in_positions.size() > static_cast<unsigned int>(3 * i.v_idx + 2));

  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 0]);
  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 1]);
  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 2]);

  if ((i.vn_idx >= 0) &&
      (static_cast<size_t>(i.vn_idx * 3 + 2) < in_normals.size())) {
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 0]);
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 1]);
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 2]);
  }

  if ((i.vt_idx >= 0) &&
      (static_cast<size_t>(i.vt_idx * 2 + 1) < in_texcoords.size())) {
    texcoords.push_back(in_texcoords[2 * static_cast<size_t>(i.vt_idx) + 0]);
    texcoords.push_back(in_texcoords[2 * static_cast<size_t>(i.vt_idx) + 1]);
  }

  unsigned int idx = static_cast<unsigned int>(positions.size() / 3 - 1);
  vertexCache[i] = idx;

  return idx;
}